

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error cio_websocket_close(cio_websocket *websocket,cio_websocket_status_code status_code,
                             char *reason,cio_websocket_write_handler_t handler,
                             void *handler_context)

{
  size_t length_00;
  size_t length;
  cio_error err;
  cio_http_client *client;
  void *handler_context_local;
  cio_websocket_write_handler_t handler_local;
  char *reason_local;
  cio_websocket_status_code status_code_local;
  cio_websocket *websocket_local;
  
  if ((websocket == (cio_websocket *)0x0) || (handler == (cio_websocket_write_handler_t)0x0)) {
    websocket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else if ((websocket->ws_private).write_close_job.wbh == (cio_write_buffer *)0x0) {
    prepare_close_job_string
              (websocket,status_code,reason,handler,handler_context,close_frame_written);
    websocket_local._4_4_ =
         cio_timer_init(&(websocket->ws_private).close_timer,
                        (((websocket->ws_private).http_client)->socket).impl.loop,
                        (cio_timer_close_hook_t)0x0);
    if (websocket_local._4_4_ == CIO_SUCCESS) {
      websocket_local._4_4_ =
           cio_timer_expires_from_now
                     (&(websocket->ws_private).close_timer,10000000000,close_timeout_handler,
                      websocket);
      if (websocket_local._4_4_ == CIO_SUCCESS) {
        *(ushort *)&(websocket->ws_private).ws_flags =
             *(ushort *)&(websocket->ws_private).ws_flags & 0xfdff | 0x200;
        length_00 = cio_write_buffer_get_total_size((websocket->ws_private).write_close_job.wbh);
        enqueue_job(websocket,&(websocket->ws_private).write_close_job,length_00);
        websocket_local._4_4_ = CIO_SUCCESS;
      }
      else {
        cio_timer_close(&(websocket->ws_private).close_timer);
      }
    }
  }
  else {
    websocket_local._4_4_ = CIO_OPERATION_NOT_PERMITTED;
  }
  return websocket_local._4_4_;
}

Assistant:

enum cio_error cio_websocket_close(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const char *reason, cio_websocket_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(websocket->ws_private.write_close_job.wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	prepare_close_job_string(websocket, status_code, reason, handler, handler_context, close_frame_written);

	struct cio_http_client *client = websocket->ws_private.http_client;
	enum cio_error err = cio_timer_init(&websocket->ws_private.close_timer, client->socket.impl.loop, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	err = cio_timer_expires_from_now(&websocket->ws_private.close_timer, CLOSE_TIMEOUT_NS, close_timeout_handler, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto timer_expires_failed;
	}

	websocket->ws_private.ws_flags.self_initiated_close = 1;
	size_t length = cio_write_buffer_get_total_size(websocket->ws_private.write_close_job.wbh);
	enqueue_job(websocket, &websocket->ws_private.write_close_job, length);

	return CIO_SUCCESS;

timer_expires_failed:
	cio_timer_close(&websocket->ws_private.close_timer);
	return err;
}